

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Barcode.cpp
# Opt level: O0

void __thiscall
ZXing::Result::Result
          (Result *this,string *text,int y,int xStart,int xStop,BarcodeFormat format,
          SymbologyIdentifier si,Error *error,bool readerInit)

{
  pointer *ppuVar1;
  ByteArray *in_RDI;
  undefined4 in_R9D;
  string *in_stack_00000010;
  byte in_stack_00000018;
  Error *in_stack_ffffffffffffff58;
  Error *in_stack_ffffffffffffff60;
  Content *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  SymbologyIdentifier si_00;
  undefined1 *local_88;
  int xStop_00;
  
  si_00 = SUB84((ulong)in_stack_ffffffffffffff70 >> 0x20,0);
  ByteArray::ByteArray(in_RDI,in_stack_00000010);
  xStop_00 = (int)((ulong)in_stack_00000010 >> 0x20);
  Content::Content(in_stack_ffffffffffffff68,(ByteArray *)in_stack_ffffffffffffff60,si_00);
  ByteArray::~ByteArray((ByteArray *)0x20ecad);
  Error::Error(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  Line<ZXing::PointT<int>>((int)((ulong)in_RDI >> 0x20),(int)in_RDI,xStop_00);
  ReaderOptions::ReaderOptions((ReaderOptions *)0x20ecfd);
  StructuredAppendInfo::StructuredAppendInfo((StructuredAppendInfo *)0x20ed10);
  *(undefined4 *)
   &in_RDI[8].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = in_R9D;
  local_88 = (undefined1 *)
             ((long)&in_RDI[8].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start + 4);
  do {
    *local_88 = 0;
    local_88 = local_88 + 1;
  } while ((pointer *)local_88 !=
           &in_RDI[8].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish);
  ppuVar1 = &in_RDI[8].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  do {
    *(undefined1 *)ppuVar1 = 0;
    ppuVar1 = (pointer *)((long)ppuVar1 + 1);
  } while (ppuVar1 !=
           (pointer *)
           ((long)&in_RDI[8].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish + 4));
  *(undefined4 *)
   ((long)&in_RDI[8].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined1 *)
   &in_RDI[8].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 0;
  *(undefined1 *)
   ((long)&in_RDI[8].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  *(byte *)((long)&in_RDI[8].super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 2) = in_stack_00000018 & 1;
  return;
}

Assistant:

Result::Result(const std::string& text, int y, int xStart, int xStop, BarcodeFormat format, SymbologyIdentifier si, Error error, bool readerInit)
	: _content({ByteArray(text)}, si),
	  _error(error),
	  _position(Line(y, xStart, xStop)),
	  _format(format),
	  _readerInit(readerInit)
{}